

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

void ecc_edwards_point_free(EdwardsPoint *ep)

{
  EdwardsPoint *ep_local;
  
  mp_free(ep->X);
  mp_free(ep->Y);
  mp_free(ep->Z);
  mp_free(ep->T);
  smemclr(ep,0x28);
  safefree(ep);
  return;
}

Assistant:

void ecc_edwards_point_free(EdwardsPoint *ep)
{
    mp_free(ep->X);
    mp_free(ep->Y);
    mp_free(ep->Z);
    mp_free(ep->T);
    smemclr(ep, sizeof(*ep));
    sfree(ep);
}